

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O0

int bitScan(U64 board)

{
  int iVar1;
  U64 board_local;
  
  iVar1 = 0;
  for (; (board & 1) == 0; board = board >> 1 | 0x8000000000000000) {
    iVar1 = iVar1 + 1;
  }
  return 0x3f - iVar1;
}

Assistant:

int bitScan(U64 board) {
  #if defined(__GNUC__) || defined(__GNUG__)
    return 63 - __builtin_ctzll(board);
  #else
  U64 LS1B = board & -board;
  int returner = 0;
  while(LS1B) {
    returner++;
    LS1B >>= 1;
  }
  return 64-returner;
  #endif
}